

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::DynamicMapField::SpaceUsedExcludingSelfNoLock(DynamicMapField *this)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  size_type sVar2;
  CppType CVar3;
  Rep *pRVar4;
  long lVar5;
  Message *message;
  size_t sVar6;
  Reflection *this_00;
  long lVar7;
  size_t sVar8;
  long lVar9;
  const_iterator it;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_40;
  
  pRVar1 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  if (pRVar1 == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    sVar8 = 0x18;
  }
  else {
    lVar7 = (long)(pRVar1->super_RepeatedPtrFieldBase).total_size_ << 3;
    pRVar4 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
    if (pRVar4 != (Rep *)0x0) {
      if (0 < pRVar4->allocated_size) {
        lVar9 = 0;
        do {
          lVar5 = (**(code **)(*pRVar4->elements[lVar9] + 0x98))();
          lVar7 = lVar7 + lVar5;
          lVar9 = lVar9 + 1;
          pRVar4 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
        } while (lVar9 < pRVar4->allocated_size);
      }
      lVar7 = lVar7 + 8;
    }
    sVar8 = lVar7 + 0x18;
  }
  sVar2 = ((this->map_).elements_)->num_elements_;
  if (sVar2 != 0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
              ((const_iterator *)&local_40,&this->map_);
    lVar9 = sVar2 * 0x20;
    CVar3 = MapKey::type(&(((local_40.node_)->kv).v_)->first);
    lVar7 = 0;
    if (CVar3 == CPPTYPE_STRING) {
      lVar7 = lVar9;
    }
    sVar8 = lVar7 + sVar8 + lVar9;
    CVar3 = MapValueRef::type(&(((local_40.node_)->kv).v_)->second);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
      sVar8 = sVar8 + sVar2 * 4;
      break;
    case CPPTYPE_INT64:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
      sVar8 = sVar8 + sVar2 * 8;
      break;
    case CPPTYPE_BOOL:
      sVar8 = sVar8 + sVar2;
      break;
    case CPPTYPE_STRING:
      sVar8 = sVar8 + lVar9;
      break;
    case CPPTYPE_MESSAGE:
      if (local_40.node_ != (Node *)0x0) {
        do {
          message = MapValueRef::GetMessageValue(&(((local_40.node_)->kv).v_)->second);
          (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          sVar6 = Reflection::SpaceUsedLong(this_00,message);
          sVar8 = sVar8 + sVar6;
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
          iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
          ::operator++(&local_40);
        } while (local_40.node_ != (Node *)0x0);
      }
    }
  }
  return sVar8;
}

Assistant:

size_t DynamicMapField::SpaceUsedExcludingSelfNoLock() const {
  size_t size = 0;
  if (MapFieldBase::repeated_field_ != NULL) {
    size += MapFieldBase::repeated_field_->SpaceUsedExcludingSelfLong();
  }
  size += sizeof(map_);
  size_t map_size = map_.size();
  if (map_size) {
    Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
    size += sizeof(it->first) * map_size;
    size += sizeof(it->second) * map_size;
    // If key is string, add the allocated space.
    if (it->first.type() == FieldDescriptor::CPPTYPE_STRING) {
      size += sizeof(std::string) * map_size;
    }
    // Add the allocated space in MapValueRef.
    switch (it->second.type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    size += sizeof(TYPE) * map_size;         \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        while (it != map_.end()) {
          const Message& message = it->second.GetMessageValue();
          size += message.GetReflection()->SpaceUsedLong(message);
          ++it;
        }
        break;
      }
    }
  }
  return size;
}